

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

rcode __thiscall olc::Sprite::SaveToPGESprFile(Sprite *this,string *sImageFile)

{
  char cVar1;
  rcode rVar2;
  ofstream ofs;
  
  if (this->pColData == (Pixel *)0x0) {
    rVar2 = FAIL;
  }
  else {
    std::ofstream::ofstream((string *)&ofs);
    std::ofstream::open((string *)&ofs,(_Ios_Openmode)sImageFile);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      std::ostream::write((char *)&ofs,(long)this);
      std::ostream::write((char *)&ofs,(long)&this->height);
      std::ostream::write((char *)&ofs,(long)this->pColData);
      std::ofstream::close();
    }
    rVar2 = (rcode)(cVar1 != '\0');
    std::ofstream::~ofstream(&ofs);
  }
  return rVar2;
}

Assistant:

olc::rcode Sprite::SaveToPGESprFile(const std::string &sImageFile)
	{
		if (pColData == nullptr)
			return olc::FAIL;

		std::ofstream ofs;
		ofs.open(sImageFile, std::ifstream::binary);
		if (ofs.is_open())
		{
			ofs.write((char *)&width, sizeof(int32_t));
			ofs.write((char *)&height, sizeof(int32_t));
			ofs.write((char *)pColData, (size_t)width * (size_t)height * sizeof(uint32_t));
			ofs.close();
			return olc::OK;
		}

		return olc::FAIL;
	}